

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O0

edge_const_shared_ptr_t __thiscall
tchecker::syncprod::edges_iterator_t::operator*(edges_iterator_t *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  edge_const_shared_ptr_t eVar3;
  edges_iterator_t *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  peVar1 = std::__shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (in_RSI);
  if (peVar1 == (element_type *)0x0) {
    eVar3 = cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
            ::values_iterator_t::operator*((values_iterator_t *)this);
    _Var2 = eVar3.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::shared_ptr<const_tchecker::system::edge_t>::shared_ptr
              (&this->_async_edge,(shared_ptr<const_tchecker::system::edge_t> *)in_RSI);
    _Var2._M_pi = extraout_RDX;
  }
  eVar3.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  eVar3.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (edge_const_shared_ptr_t)
         eVar3.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

tchecker::system::edge_const_shared_ptr_t edges_iterator_t::operator*()
{
  if (_async_edge.get() == nullptr)
    return *_sync_it;
  return _async_edge;
}